

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02-basic.cpp
# Opt level: O1

void bar(Slacking *slack)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [16];
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"#mychannel","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"botname","");
  local_48._M_allocated_capacity = (size_type)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,":bird:","");
  std::__cxx11::string::_M_assign((string *)&slack->chat);
  std::__cxx11::string::_M_assign((string *)&(slack->chat).username);
  std::__cxx11::string::_M_assign((string *)&(slack->chat).icon_emoji);
  if ((undefined1 *)local_48._M_allocated_capacity != local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"bar() function is called","")
  ;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  ::slack::_detail::CategoryChat::postMessage
            ((CategoryChat *)local_58,&(slack->chat).channel,&local_98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

void bar(slack::Slacking& slack) {
    // You can try catch API method if an error occur
    try {
        slack.chat.channel_username_iconemoji("#mychannel", "botname", ":bird:"); // for lazy people
        slack.chat.postMessage("bar() function is called");
    }
    catch(std::exception const& e) {
        std::cerr << e.what() << '\n';
    }
}